

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_parse_certificate_verify(mbedtls_ssl_context *ssl)

{
  int iVar1;
  size_t sVar2;
  size_t sig_len_00;
  size_t local_98;
  size_t dummy_hlen;
  mbedtls_pk_context_conflict *peer_pk;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t pk_alg;
  size_t hashlen;
  uchar *hash_start;
  uchar hash [48];
  size_t sig_len;
  size_t i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  hashlen = (size_t)&hash_start;
  peer_pk = (mbedtls_pk_context_conflict *)ssl->handshake->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
             ,0xff4,"=> parse certificate verify");
  iVar1 = mbedtls_ssl_ciphersuite_cert_req_allowed((mbedtls_ssl_ciphersuite_t *)peer_pk);
  if (iVar1 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xff7,"<= skip parse certificate verify");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xffe,"<= skip parse certificate verify");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = mbedtls_ssl_read_record(ssl,0);
    if (ssl_local._4_4_ == 0) {
      ssl->state = ssl->state + 1;
      if ((ssl->in_msgtype == 0x16) && (*ssl->in_msg == '\x0f')) {
        sVar2 = mbedtls_ssl_hs_hdr_len(ssl);
        if (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
          ssl_local._4_4_ = -0x6c00;
        }
        else {
          dummy_hlen = (size_t)&ssl->session_negotiate->peer_cert->pk;
          if (ssl->in_hslen < sVar2 + 2) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x102d,"bad certificate verify message");
            ssl_local._4_4_ = -0x7300;
          }
          else {
            ciphersuite_info._0_4_ = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[sVar2]);
            if (((mbedtls_md_type_t)ciphersuite_info != MBEDTLS_MD_NONE) &&
               (iVar1 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)ssl->in_msg[sVar2]), iVar1 == 0)) {
              if ((mbedtls_md_type_t)ciphersuite_info == MBEDTLS_MD_SHA1) {
                hashlen = hashlen + 0x10;
              }
              _md_alg = 0;
              ciphersuite_info._4_4_ = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[sVar2 + 1]);
              if (ciphersuite_info._4_4_ == MBEDTLS_PK_NONE) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x104d,"peer not adhering to requested sig_alg for verify message");
                return -0x6600;
              }
              iVar1 = mbedtls_pk_can_do((mbedtls_pk_context_conflict *)dummy_hlen,
                                        ciphersuite_info._4_4_);
              if (iVar1 == 0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x1055,"sig_alg doesn\'t match cert key");
                return -0x6600;
              }
              if (ssl->in_hslen < sVar2 + 4) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x105c,"bad certificate verify message");
                return -0x7300;
              }
              sig_len_00 = (size_t)(int)(uint)CONCAT11(ssl->in_msg[sVar2 + 2],ssl->in_msg[sVar2 + 3]
                                                      );
              if (sVar2 + 4 + sig_len_00 != ssl->in_hslen) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x1064,"bad certificate verify message");
                return -0x7300;
              }
              iVar1 = (*ssl->handshake->calc_verify)(ssl,(uchar *)&hash_start,&local_98);
              if (iVar1 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x106d,"calc_verify",iVar1);
                return iVar1;
              }
              iVar1 = mbedtls_pk_verify((mbedtls_pk_context_conflict *)dummy_hlen,
                                        (mbedtls_md_type_t)ciphersuite_info,(uchar *)hashlen,_md_alg
                                        ,ssl->in_msg + sVar2 + 4,sig_len_00);
              if (iVar1 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x1075,"mbedtls_pk_verify",iVar1);
                return iVar1;
              }
              iVar1 = mbedtls_ssl_update_handshake_status(ssl);
              if (iVar1 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x107b,"mbedtls_ssl_update_handshake_status",iVar1);
                return iVar1;
              }
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                         ,0x107f,"<= parse certificate verify");
              return 0;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x1038,"peer not adhering to requested sig_alg for verify message");
            ssl_local._4_4_ = -0x6600;
          }
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x1016,"bad certificate verify message");
        ssl_local._4_4_ = -0x7700;
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x100d,"mbedtls_ssl_read_record",ssl_local._4_4_);
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_certificate_verify(mbedtls_ssl_context *ssl,
                                        int authmode,
                                        mbedtls_x509_crt *chain,
                                        void *rs_ctx)
{
    int ret = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
        ssl->handshake->ciphersuite_info;
    int have_ca_chain = 0;

    int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *);
    void *p_vrfy;

    if (authmode == MBEDTLS_SSL_VERIFY_NONE) {
        return 0;
    }

    if (ssl->f_vrfy != NULL) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("Use context-specific verification callback"));
        f_vrfy = ssl->f_vrfy;
        p_vrfy = ssl->p_vrfy;
    } else {
        MBEDTLS_SSL_DEBUG_MSG(3, ("Use configuration-specific verification callback"));
        f_vrfy = ssl->conf->f_vrfy;
        p_vrfy = ssl->conf->p_vrfy;
    }

    /*
     * Main check: verify certificate
     */
#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
    if (ssl->conf->f_ca_cb != NULL) {
        ((void) rs_ctx);
        have_ca_chain = 1;

        MBEDTLS_SSL_DEBUG_MSG(3, ("use CA callback for X.509 CRT verification"));
        ret = mbedtls_x509_crt_verify_with_ca_cb(
            chain,
            ssl->conf->f_ca_cb,
            ssl->conf->p_ca_cb,
            ssl->conf->cert_profile,
            ssl->hostname,
            &ssl->session_negotiate->verify_result,
            f_vrfy, p_vrfy);
    } else
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */
    {
        mbedtls_x509_crt *ca_chain;
        mbedtls_x509_crl *ca_crl;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
        if (ssl->handshake->sni_ca_chain != NULL) {
            ca_chain = ssl->handshake->sni_ca_chain;
            ca_crl   = ssl->handshake->sni_ca_crl;
        } else
#endif
        {
            ca_chain = ssl->conf->ca_chain;
            ca_crl   = ssl->conf->ca_crl;
        }

        if (ca_chain != NULL) {
            have_ca_chain = 1;
        }

        ret = mbedtls_x509_crt_verify_restartable(
            chain,
            ca_chain, ca_crl,
            ssl->conf->cert_profile,
            ssl->hostname,
            &ssl->session_negotiate->verify_result,
            f_vrfy, p_vrfy, rs_ctx);
    }

    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "x509_verify_cert", ret);
    }

#if defined(MBEDTLS_SSL_ECP_RESTARTABLE_ENABLED)
    if (ret == MBEDTLS_ERR_ECP_IN_PROGRESS) {
        return MBEDTLS_ERR_SSL_CRYPTO_IN_PROGRESS;
    }
#endif

    /*
     * Secondary checks: always done, but change 'ret' only if it was 0
     */

#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    {
        const mbedtls_pk_context *pk = &chain->pk;

        /* If certificate uses an EC key, make sure the curve is OK.
         * This is a public key, so it can't be opaque, so can_do() is a good
         * enough check to ensure pk_ec() is safe to use here. */
        if (mbedtls_pk_can_do(pk, MBEDTLS_PK_ECKEY)) {
            /* and in the unlikely case the above assumption no longer holds
             * we are making sure that pk_ec() here does not return a NULL
             */
            mbedtls_ecp_group_id grp_id = mbedtls_pk_get_group_id(pk);
            if (grp_id == MBEDTLS_ECP_DP_NONE) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("invalid group ID"));
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }
            if (mbedtls_ssl_check_curve(ssl, grp_id) != 0) {
                ssl->session_negotiate->verify_result |=
                    MBEDTLS_X509_BADCERT_BAD_KEY;

                MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate (EC key curve)"));
                if (ret == 0) {
                    ret = MBEDTLS_ERR_SSL_BAD_CERTIFICATE;
                }
            }
        }
    }
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */

    if (mbedtls_ssl_check_cert_usage(chain,
                                     ciphersuite_info,
                                     !ssl->conf->endpoint,
                                     &ssl->session_negotiate->verify_result) != 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate (usage extensions)"));
        if (ret == 0) {
            ret = MBEDTLS_ERR_SSL_BAD_CERTIFICATE;
        }
    }

    /* mbedtls_x509_crt_verify_with_profile is supposed to report a
     * verification failure through MBEDTLS_ERR_X509_CERT_VERIFY_FAILED,
     * with details encoded in the verification flags. All other kinds
     * of error codes, including those from the user provided f_vrfy
     * functions, are treated as fatal and lead to a failure of
     * ssl_parse_certificate even if verification was optional. */
    if (authmode == MBEDTLS_SSL_VERIFY_OPTIONAL &&
        (ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED ||
         ret == MBEDTLS_ERR_SSL_BAD_CERTIFICATE)) {
        ret = 0;
    }

    if (have_ca_chain == 0 && authmode == MBEDTLS_SSL_VERIFY_REQUIRED) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("got no CA chain"));
        ret = MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED;
    }

    if (ret != 0) {
        uint8_t alert;

        /* The certificate may have been rejected for several reasons.
           Pick one and send the corresponding alert. Which alert to send
           may be a subject of debate in some cases. */
        if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_OTHER) {
            alert = MBEDTLS_SSL_ALERT_MSG_ACCESS_DENIED;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_CN_MISMATCH) {
            alert = MBEDTLS_SSL_ALERT_MSG_BAD_CERT;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_KEY_USAGE) {
            alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_EXT_KEY_USAGE) {
            alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_NS_CERT_TYPE) {
            alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_BAD_PK) {
            alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_BAD_KEY) {
            alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_EXPIRED) {
            alert = MBEDTLS_SSL_ALERT_MSG_CERT_EXPIRED;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_REVOKED) {
            alert = MBEDTLS_SSL_ALERT_MSG_CERT_REVOKED;
        } else if (ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_NOT_TRUSTED) {
            alert = MBEDTLS_SSL_ALERT_MSG_UNKNOWN_CA;
        } else {
            alert = MBEDTLS_SSL_ALERT_MSG_CERT_UNKNOWN;
        }
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       alert);
    }

#if defined(MBEDTLS_DEBUG_C)
    if (ssl->session_negotiate->verify_result != 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("! Certificate verification flags %08x",
                                  (unsigned int) ssl->session_negotiate->verify_result));
    } else {
        MBEDTLS_SSL_DEBUG_MSG(3, ("Certificate verification flags clear"));
    }
#endif /* MBEDTLS_DEBUG_C */

    return ret;
}